

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::NetworkDataToJson_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,NetworkData *aNetworkData)

{
  Json json;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json<const_ot::commissioner::NetworkData_&,_ot::commissioner::NetworkData,_0>
            (&json,(NetworkData *)this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(__return_storage_ptr__,&json,4,' ',false,strict);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  return __return_storage_ptr__;
}

Assistant:

std::string NetworkDataToJson(const NetworkData &aNetworkData)
{
    Json json = aNetworkData;
    return json.dump(JSON_INDENT_DEFAULT);
}